

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mcpl.c
# Opt level: O2

int mcpl_skipforward(mcpl_file_t ff,uint64_t n)

{
  ulong uVar1;
  uint uVar2;
  int iVar3;
  ulong uVar4;
  bool bVar5;
  
  uVar1 = *(ulong *)((long)ff.internal + 0x40);
  if ((n < uVar1) && (*(ulong *)((long)ff.internal + 0x88) < uVar1)) {
    uVar4 = *(ulong *)((long)ff.internal + 0x88) + n;
    *(ulong *)((long)ff.internal + 0x88) = uVar4;
    bVar5 = uVar4 < uVar1;
    if (uVar4 <= uVar1) {
      if (n != 0 && bVar5) {
        if (*(gzFile *)((long)ff.internal + 8) == (gzFile)0x0) {
          iVar3 = fseek(*ff.internal,*(uint *)((long)ff.internal + 0x78) * n,1);
          uVar2 = (uint)(iVar3 != 0);
        }
        else {
          uVar2 = mcpl_gzseek(*(gzFile *)((long)ff.internal + 8),
                              uVar4 * *(uint *)((long)ff.internal + 0x78) +
                              *(long *)((long)ff.internal + 0x80));
          uVar2 = uVar2 ^ 1;
        }
        if (uVar2 != 0) {
          mcpl_error("Errors encountered while skipping in particle list");
        }
      }
      goto LAB_0010451d;
    }
  }
  *(ulong *)((long)ff.internal + 0x88) = uVar1;
  bVar5 = false;
LAB_0010451d:
  return (int)bVar5;
}

Assistant:

int mcpl_skipforward(mcpl_file_t ff,uint64_t n)
{
  MCPLIMP_FILEDECODE;
  //increment, but guard against overflows:
  if ( n >= f->nparticles || f->current_particle_idx >= f->nparticles )
    f->current_particle_idx = f->nparticles;
  else
    f->current_particle_idx += n;
  if ( f->current_particle_idx > f->nparticles )
    f->current_particle_idx = f->nparticles;

  int notEOF = f->current_particle_idx<f->nparticles;
  if (n==0)
    return notEOF;
  if (notEOF) {
    int error;
    if (f->filegz) {
      int64_t targetpos = f->current_particle_idx*f->particle_size+f->first_particle_pos;
      error = ! mcpl_gzseek(f->filegz, targetpos );
    } else {
      error = MCPL_FSEEK_CUR( f->file, f->particle_size * n )!=0;
    }
    if (error)
      mcpl_error("Errors encountered while skipping in particle list");
  }
  return notEOF;
}